

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetNoInactiveRootWarn(void *arkode_mem)

{
  ARKodeMem in_RDI;
  ARKodeRootMem ark_root_mem;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetNoInactiveRootWarn",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->root_mem == (ARKodeRootMem)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode","arkSetNoInactiveRootWarn","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    in_RDI->root_mem->mxgnull = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetNoInactiveRootWarn(void *arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetNoInactiveRootWarn", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  if (ark_mem->root_mem == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkSetNoInactiveRootWarn", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem) ark_mem->root_mem;
  ark_root_mem->mxgnull = 0;
  return(ARK_SUCCESS);
}